

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::ExtensionRangeOptions::ExtensionRangeOptions
          (ExtensionRangeOptions *this,Arena *arena)

{
  Arena *in_RSI;
  ExtensionRangeOptions *in_RDI;
  Arena *in_stack_00000008;
  ExtensionSet *in_stack_00000010;
  Arena *in_stack_ffffffffffffffa8;
  InternalMetadataWithArena *in_stack_ffffffffffffffb0;
  
  Message::Message((Message *)in_stack_ffffffffffffffb0);
  (in_RDI->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__ExtensionRangeOptions_009673f0;
  internal::ExtensionSet::ExtensionSet(in_stack_00000010,in_stack_00000008);
  internal::InternalMetadataWithArena::InternalMetadataWithArena
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  memset(&in_RDI->_has_bits_,0,4);
  internal::CachedSize::CachedSize((CachedSize *)0x5151a2);
  RepeatedPtrField<google::protobuf::UninterpretedOption>::RepeatedPtrField
            (&in_RDI->uninterpreted_option_,in_stack_ffffffffffffffa8);
  SharedCtor((ExtensionRangeOptions *)0x5151c6);
  RegisterArenaDtor(in_RDI,in_RSI);
  return;
}

Assistant:

ExtensionRangeOptions::ExtensionRangeOptions(::PROTOBUF_NAMESPACE_ID::Arena* arena)
  : ::PROTOBUF_NAMESPACE_ID::Message(),
  _extensions_(arena),
  _internal_metadata_(arena),
  uninterpreted_option_(arena) {
  SharedCtor();
  RegisterArenaDtor(arena);
  // @@protoc_insertion_point(arena_constructor:google.protobuf.ExtensionRangeOptions)
}